

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::setKernelArgUSMPointer(CLIntercept *this,cl_kernel kernel,cl_uint arg_index,void *arg)

{
  mutex *__mutex;
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  mapped_type *this_00;
  mapped_type *ppvVar4;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  mapped_type pvVar7;
  bool bVar8;
  cl_uint local_2c;
  cl_kernel local_28;
  
  __mutex = &this->m_Mutex;
  local_2c = arg_index;
  local_28 = kernel;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    uVar5 = std::__throw_system_error(iVar1);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar5);
  }
  if ((this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
  goto LAB_0017cabf;
  p_Var6 = (this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &(this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var3 = p_Var2;
  if (p_Var6 == (_Rb_tree_node_base *)0x0) {
LAB_0017ca7e:
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var2);
    pvVar7 = *(mapped_type *)(p_Var3 + 1);
  }
  else {
    do {
      if (*(void **)(p_Var6 + 1) >= arg) {
        p_Var3 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[*(void **)(p_Var6 + 1) < arg];
    } while (p_Var6 != (_Base_ptr)0x0);
    bVar8 = p_Var3 == p_Var2;
    p_Var2 = p_Var3;
    if ((bVar8) ||
       ((pvVar7 = *(mapped_type *)(p_Var3 + 1), pvVar7 != arg &&
        (p_Var3 != (this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)))
       ) goto LAB_0017ca7e;
  }
  if ((pvVar7 <= arg) && (arg < (void *)((long)&(p_Var3[1]._M_parent)->_M_color + (long)pvVar7))) {
    this_00 = std::
              map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
              ::operator[](&this->m_KernelArgMemMap,&local_28);
    ppvVar4 = std::
              map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
              ::operator[](this_00,&local_2c);
    *ppvVar4 = pvVar7;
  }
LAB_0017cabf:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void CLIntercept::setKernelArgUSMPointer(
    cl_kernel kernel,
    cl_uint arg_index,
    const void* arg )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( m_USMAllocInfoMap.empty() )
    {
        return;
    }

    CUSMAllocInfoMap::iterator iter = m_USMAllocInfoMap.lower_bound( arg );
    if( iter == m_USMAllocInfoMap.end() || (iter->first != arg && iter != m_USMAllocInfoMap.begin()) )
    {
        // Go to the previous iterator.
        --iter;
    }

    const void* startPtr = iter->first;
    const void* endPtr = (const char*)startPtr + iter->second;
    if( arg >= startPtr && arg < endPtr )
    {
        CArgMemMap& argMemMap = m_KernelArgMemMap[ kernel ];
        argMemMap[ arg_index ] = startPtr;
    }
}